

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

int dotele(void)

{
  uint uVar1;
  short sVar2;
  bool bVar3;
  char cVar4;
  boolean bVar5;
  schar sVar6;
  trap *trap;
  long lVar7;
  char *line;
  int iVar8;
  char *pcVar9;
  
  trap = t_at(level,(int)u.ux,(int)u.uy);
  if ((trap != (trap *)0x0) && ((trap->field_0x8 & 0x3f) == 0x30)) {
    if ((trap->field_0x8 & 0x40) != 0) {
      pline("This is a vault teleport, usable once only.");
      cVar4 = yn_function("Jump in?","yn",'n');
      if (cVar4 == 'n') goto LAB_0025a8f8;
      deltrap(level,trap);
      newsym((int)u.ux,(int)u.uy);
    }
    pcVar9 = locomotion(youmonst.data,"jump");
    pline("You %s onto the teleportation trap.",pcVar9);
    bVar5 = next_to_u();
    if (bVar5 != '\0') {
      if ((trap->field_0x8 & 0x40) != 0) {
        vault_tele();
        next_to_u();
        return 1;
      }
      bVar3 = false;
      goto LAB_0025ab2f;
    }
LAB_0025ab5c:
    pcVar9 = "You shudder for a moment.";
LAB_0025abc5:
    pline(pcVar9);
    return 0;
  }
LAB_0025a8f8:
  if ((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
     (uVar1 = (youmonst.data)->mflags1, (uVar1 >> 0x19 & 1) != 0)) {
    lVar7 = 0;
    bVar3 = true;
    pcVar9 = "to teleport";
    if ((u.ulevel < (int)((uint)(urole.malenum != 0x168) * 4 + 8)) &&
       (uVar1 = (youmonst.data)->mflags1, (uVar1 >> 0x19 & 1) == 0)) goto LAB_0025a965;
  }
  else {
LAB_0025a965:
    lVar7 = 0;
    if (((objects[0x19f].field_0x10 & 1) != 0) && (u.uprops[0x1c].intrinsic == 0)) {
      lVar7 = 0;
      do {
        if (spl_book[lVar7].sp_id == 0x19f) {
          pcVar9 = "for a teleport spell";
          bVar3 = false;
          goto LAB_0025a9e1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x2b);
      lVar7 = 0x2b;
    }
    if (flags.debug == '\0') {
      if ((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) || (uVar1 >> 0x19 & 1) != 0
         ) {
        pcVar9 = "You are not able to teleport at will.";
      }
      else {
        pcVar9 = "You don\'t know that spell.";
      }
      goto LAB_0025abc5;
    }
    bVar3 = true;
    pcVar9 = "to teleport";
  }
LAB_0025a9e1:
  if (u.uhunger < 0x65) {
    if (flags.debug != '\0') {
LAB_0025a9fe:
      sVar2 = objects[0x19f].oc_oc2 * 7;
      iVar8 = (int)(short)((short)((uint)(int)(short)(sVar2 - (sVar2 >> 0xf)) >> 1) + -2);
      if ((u.uen <= iVar8) && (iVar8 = u.uen, flags.debug == '\0')) {
        line = "You lack the energy %s.";
        goto LAB_0025aacb;
      }
      bVar5 = check_capacity("Your concentration falters from carrying so much.");
      if (bVar5 != '\0') {
        return 1;
      }
      if (bVar3) {
        u.uen = u.uen - iVar8;
        iflags.botl = '\x01';
      }
      else {
        exercise(2,'\x01');
        iVar8 = spelleffects((int)lVar7,'\x01');
        if (iVar8 != 0) {
          return 1;
        }
        if (flags.debug == '\0') {
          return 0;
        }
      }
      bVar5 = next_to_u();
      bVar3 = true;
      if (bVar5 != '\0') {
LAB_0025ab2f:
        iVar8 = tele((char *)0x0);
        if (iVar8 == 0) {
          return 0;
        }
        next_to_u();
        if (bVar3) {
          morehungry(100);
          return 1;
        }
        return 1;
      }
      goto LAB_0025ab5c;
    }
  }
  else {
    sVar6 = acurr(0);
    if (flags.debug != '\0' || '\x05' < sVar6) goto LAB_0025a9fe;
  }
  pcVar9 = "for a teleport spell";
  if (bVar3) {
    pcVar9 = "to teleport";
  }
  line = "You lack the strength %s.";
LAB_0025aacb:
  pline(line,pcVar9);
  return 1;
}

Assistant:

int dotele(void)
{
	struct trap *trap;

	trap = t_at(level, u.ux, u.uy);
	if (trap && (!trap->tseen || trap->ttyp != TELEP_TRAP))
		trap = 0;

	if (trap) {
		if (trap->once) {
			pline("This is a vault teleport, usable once only.");
			if (yn("Jump in?") == 'n')
				trap = 0;
			else {
				deltrap(level, trap);
				newsym(u.ux, u.uy);
			}
		}
		if (trap)
			pline("You %s onto the teleportation trap.",
			    locomotion(youmonst.data, "jump"));
	}
	if (!trap) {
	    boolean castit = FALSE;
	    int sp_no = 0, energy = 0;

	    if (!Teleportation || (u.ulevel < (Role_if (PM_WIZARD) ? 8 : 12)
					&& !can_teleport(youmonst.data))) {
		/* Try to use teleport away spell. */
		if (objects[SPE_TELEPORT_AWAY].oc_name_known && !Confusion)
		    for (sp_no = 0; sp_no < MAXSPELL; sp_no++)
			if (spl_book[sp_no].sp_id == SPE_TELEPORT_AWAY) {
				castit = TRUE;
				break;
			}
		if (!wizard) {
		    if (!castit) {
			if (!Teleportation)
			    pline("You don't know that spell.");
			else pline("You are not able to teleport at will.");
			return 0;
		    }
		}
	    }

	    if (u.uhunger <= 100 || ACURR(A_STR) < 6) {
		if (!wizard) {
			pline("You lack the strength %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    energy = objects[SPE_TELEPORT_AWAY].oc_level * 7 / 2 - 2;
	    if (u.uen <= energy) {
		if (wizard)
			energy = u.uen;
		else
		{
			pline("You lack the energy %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    if (check_capacity(
			"Your concentration falters from carrying so much."))
		return 1;

	    if (castit) {
		exercise(A_WIS, TRUE);
		if (spelleffects(sp_no, TRUE))
			return 1;
		else
		    if (!wizard)
			return 0;
	    } else {
		u.uen -= energy;
		iflags.botl = 1;
	    }
	}

	if (next_to_u()) {
		if (trap && trap->once) vault_tele();
		else if (!tele(NULL)) return 0;
		next_to_u();
	} else {
		pline("You shudder for a moment.");
		return 0;
	}
	if (!trap) morehungry(100);
	return 1;
}